

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O3

EnumeratorDeclarationSymbol * __thiscall
psy::C::SemanticModel::enumeratorFor(SemanticModel *this,EnumeratorDeclarationSyntax *node)

{
  SymbolKind SVar1;
  int iVar2;
  iterator iVar3;
  Symbol *this_00;
  undefined4 extraout_var;
  ostream *poVar4;
  EnumeratorDeclarationSyntax *local_10;
  
  local_10 = node;
  iVar3 = std::
          _Hashtable<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->impl_)._M_t.
                    super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                    .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>.
                   _M_head_impl)->declsBySyntax_)._M_h,(key_type *)&local_10);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (((this->impl_)._M_t.
         super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
         .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>._M_head_impl)->
        bindingIsOK_ != true) {
      return (EnumeratorDeclarationSymbol *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar2 = 0xe9;
  }
  else {
    this_00 = (Symbol *)
              (**(code **)(**(long **)((long)iVar3.
                                             super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_psy::C::DeclarationSymbol_*>,_false>
                                             ._M_cur + 0x10) + 0x30))();
    SVar1 = Symbol::kind(this_00);
    if (SVar1 == EnumeratorDeclaration) {
      iVar2 = (*this_00->_vptr_Symbol[0x12])(this_00);
      return (EnumeratorDeclarationSymbol *)CONCAT44(extraout_var,iVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar2 = 0xed;
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return (EnumeratorDeclarationSymbol *)0x0;
}

Assistant:

EnumeratorDeclarationSymbol* SemanticModel::enumeratorFor(
        const EnumeratorDeclarationSyntax* node)
{
    auto it = P->declsBySyntax_.find(node);
    if (it == P->declsBySyntax_.end()) {
        PSY_ASSERT_1(!P->bindingIsOK_);
        return nullptr;
    }
    auto decl = it->second->asDeclaration();
    PSY_ASSERT_2(decl->kind() == SymbolKind::EnumeratorDeclaration, return nullptr);
    return decl->asEnumeratorDeclaration();
}